

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  
  test1<nrg::SyncExecutor>("SyncExecution");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution (default)");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
  test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
  test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");
  testAsyncTimed();
  measure<nrg::SyncExecutor>("SyncExecution",2);
  measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution",2);
  measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution",2);
  measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SynExecution: ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Async-InstantExecution: ",0x18);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Async-TimedExecution: ",0x16);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Async-PrioExecution: ",0x15);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  test<nrg::AsyncExecutor<nrg::TimedExecution>>();
  testTimed();
  return 0;
}

Assistant:

int main()
{
    test1<nrg::SyncExecutor>("SyncExecution");
    test1<nrg::AsyncExecutor<>>("Async-InstantExecution (default)");
    test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
    test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
    test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");

    testAsyncTimed();

    auto t1 = measure<nrg::SyncExecutor>("SyncExecution", 2);
    auto t2 = measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution", 2);
    auto t3 = measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution", 2);
    auto t4 = measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution", 2);

    using namespace std::chrono;
    std::cout << "SynExecution: " << duration_cast<milliseconds>(t1).count() << " ms\n";
    std::cout << "Async-InstantExecution: " << duration_cast<milliseconds>(t2).count() << " ms\n";
    std::cout << "Async-TimedExecution: " << duration_cast<milliseconds>(t3).count() << " ms\n";
    std::cout << "Async-PrioExecution: " << duration_cast<milliseconds>(t4).count() << " ms\n";

    test<nrg::AsyncExecutor<nrg::TimedExecution>>();

    testTimed();
}